

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void fixjump(FuncState *fs,int pc,int dest)

{
  int iVar1;
  int iVar2;
  int offset;
  Instruction *jmp;
  int dest_local;
  int pc_local;
  FuncState *fs_local;
  
  iVar1 = dest - (pc + 1);
  if (dest == -1) {
    __assert_fail("dest != (-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x71,"void fixjump(FuncState *, int, int)");
  }
  iVar2 = iVar1;
  if (iVar1 < 1) {
    iVar2 = -iVar1;
  }
  if (0x8000 < iVar2) {
    luaX_syntaxerror(fs->ls,"control structure too long");
  }
  *(short *)((long)fs->f->code + (long)pc * 4 + 2) = (short)iVar1 + -0x8000;
  return;
}

Assistant:

static void fixjump (FuncState *fs, int pc, int dest) {
  Instruction *jmp = &fs->f->code[pc];
  int offset = dest - (pc + 1);
  lua_assert(dest != NO_JUMP);
  if (abs(offset) > MAXARG_sBx)
    luaX_syntaxerror(fs->ls, "control structure too long");
  SETARG_sBx(*jmp, offset);
}